

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

void free_codes(archive_read *a)

{
  long lVar1;
  long in_RDI;
  rar *rar;
  
  lVar1 = **(long **)(in_RDI + 0x948);
  free(*(void **)(lVar1 + 0x108));
  free(*(void **)(lVar1 + 0x128));
  free(*(void **)(lVar1 + 0x148));
  free(*(void **)(lVar1 + 0x168));
  free(*(void **)(lVar1 + 0x120));
  free(*(void **)(lVar1 + 0x140));
  free(*(void **)(lVar1 + 0x160));
  free(*(void **)(lVar1 + 0x180));
  memset((void *)(lVar1 + 0x108),0,0x20);
  memset((void *)(lVar1 + 0x128),0,0x20);
  memset((void *)(lVar1 + 0x148),0,0x20);
  memset((void *)(lVar1 + 0x168),0,0x20);
  return;
}

Assistant:

static void
free_codes(struct archive_read *a)
{
  struct rar *rar = (struct rar *)(a->format->data);
  free(rar->maincode.tree);
  free(rar->offsetcode.tree);
  free(rar->lowoffsetcode.tree);
  free(rar->lengthcode.tree);
  free(rar->maincode.table);
  free(rar->offsetcode.table);
  free(rar->lowoffsetcode.table);
  free(rar->lengthcode.table);
  memset(&rar->maincode, 0, sizeof(rar->maincode));
  memset(&rar->offsetcode, 0, sizeof(rar->offsetcode));
  memset(&rar->lowoffsetcode, 0, sizeof(rar->lowoffsetcode));
  memset(&rar->lengthcode, 0, sizeof(rar->lengthcode));
}